

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fluid.cxx
# Opt level: O0

void open_cb(Fl_Widget *param_1,void *v)

{
  int iVar1;
  char *c_00;
  int *piVar2;
  char *pcVar3;
  undefined1 local_78 [8];
  Fl_Native_File_Chooser fnfc;
  char *oldfilename;
  char *c;
  void *v_local;
  Fl_Widget *param_0_local;
  
  if (((v != (void *)0x0) || (modflag == 0)) ||
     ((iVar1 = fl_choice("Do you want to save changes to this user\ninterface before opening another one?"
                         ,"Cancel","Save","Don\'t Save"), iVar1 != 0 &&
      ((iVar1 != 1 || (save_cb((Fl_Widget *)0x0,(void *)0x0), modflag == 0)))))) {
    Fl_Native_File_Chooser::Fl_Native_File_Chooser((Fl_Native_File_Chooser *)local_78,0);
    Fl_Native_File_Chooser::title((Fl_Native_File_Chooser *)local_78,"Open:");
    Fl_Native_File_Chooser::type((Fl_Native_File_Chooser *)local_78,0);
    Fl_Native_File_Chooser::filter((Fl_Native_File_Chooser *)local_78,"FLUID Files\t*.f[ld]\n");
    iVar1 = Fl_Native_File_Chooser::show((Fl_Native_File_Chooser *)local_78);
    if (iVar1 == 0) {
      c_00 = Fl_Native_File_Chooser::filename((Fl_Native_File_Chooser *)local_78);
      fnfc.field_10._x11_file_chooser = (Fl_FLTK_File_Chooser *)filename;
      filename = (char *)0x0;
      set_filename(c_00);
      if (v != (void *)0x0) {
        undo_checkpoint();
      }
      undo_suspend();
      iVar1 = read_file(c_00,(uint)(v != (void *)0x0));
      if (iVar1 == 0) {
        undo_resume();
        piVar2 = __errno_location();
        pcVar3 = strerror(*piVar2);
        fl_message("Can\'t read %s: %s",c_00,pcVar3);
        free(filename);
        filename = (char *)fnfc.field_10._x11_file_chooser;
        if (main_window != (Fl_Window *)0x0) {
          set_modflag(modflag);
        }
      }
      else {
        undo_resume();
        if (v == (void *)0x0) {
          set_modflag(0);
          undo_clear();
          if (fnfc.field_10._x11_file_chooser != (Fl_FLTK_File_Chooser *)0x0) {
            free(fnfc.field_10._x11_file_chooser);
          }
        }
        else {
          free(filename);
          filename = (char *)fnfc.field_10._x11_file_chooser;
          set_modflag(1);
        }
      }
    }
    Fl_Native_File_Chooser::~Fl_Native_File_Chooser((Fl_Native_File_Chooser *)local_78);
  }
  return;
}

Assistant:

void open_cb(Fl_Widget *, void *v) {
  if (!v && modflag) {
    switch (fl_choice("Do you want to save changes to this user\n"
                      "interface before opening another one?", "Cancel",
                      "Save", "Don't Save"))
    {
      case 0 : /* Cancel */
          return;
      case 1 : /* Save */
          save_cb(NULL, NULL);
	  if (modflag) return;	// Didn't save!
    }
  }
  const char *c;
  const char *oldfilename;
  Fl_Native_File_Chooser fnfc;
  fnfc.title("Open:");
  fnfc.type(Fl_Native_File_Chooser::BROWSE_FILE);
  fnfc.filter("FLUID Files\t*.f[ld]\n");
  if (fnfc.show() != 0) return;
  c = fnfc.filename();
  oldfilename = filename;
  filename    = NULL;
  set_filename(c);
  if (v != 0) undo_checkpoint();
  undo_suspend();
  if (!read_file(c, v!=0)) {
    undo_resume();
    fl_message("Can't read %s: %s", c, strerror(errno));
    free((void *)filename);
    filename = oldfilename;
    if (main_window) set_modflag(modflag);
    return;
  }
  undo_resume();
  if (v) {
    // Inserting a file; restore the original filename...
    free((void *)filename);
    filename = oldfilename;
    set_modflag(1);
  } else {
    // Loaded a file; free the old filename...
    set_modflag(0);
    undo_clear();
    if (oldfilename) free((void *)oldfilename);
  }
}